

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpanel_bmod.c
# Opt level: O3

void zpanel_bmod(int m,int w,int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  long lVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  flops_t *pfVar13;
  int *piVar14;
  int *piVar15;
  int_t *piVar16;
  int_t *piVar17;
  void *pvVar18;
  int_t *piVar19;
  doublecomplex dVar20;
  doublecomplex dVar21;
  doublecomplex dVar22;
  doublecomplex dVar23;
  doublecomplex dVar24;
  doublecomplex dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  doublecomplex *pdVar38;
  int iVar39;
  double *pdVar40;
  doublecomplex *pdVar41;
  int iVar42;
  long lVar43;
  int *piVar44;
  ulong uVar45;
  doublecomplex *pdVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  ulong uVar54;
  int iVar55;
  int iVar56;
  ulong uVar57;
  int iVar58;
  doublecomplex *pdVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  int local_168;
  
  pfVar13 = stat->ops;
  piVar14 = Glu->xsup;
  piVar15 = Glu->supno;
  piVar16 = Glu->lsub;
  piVar17 = Glu->xlsub;
  pvVar18 = Glu->lusup;
  piVar19 = Glu->xlusup;
  iVar30 = sp_ienv(3);
  iVar31 = sp_ienv(7);
  iVar30 = sp_ienv((uint)(iVar30 <= iVar31) * 4 + 3);
  iVar31 = sp_ienv(4);
  iVar32 = sp_ienv(5);
  if (0 < nseg) {
    iVar33 = iVar31 + iVar30;
    iVar55 = jcol + w;
    uVar45 = (ulong)(uint)nseg;
    lVar1 = (long)pvVar18 + 0x18;
    iVar51 = 0;
    do {
      iVar10 = segrep[uVar45 - 1];
      iVar11 = piVar14[piVar15[iVar10]];
      iVar53 = iVar10 - iVar11;
      iVar58 = iVar53 + 1;
      iVar12 = piVar17[iVar11];
      iVar34 = piVar17[(long)iVar11 + 1] - iVar12;
      iVar42 = iVar34 - iVar58;
      local_168 = iVar12 + iVar53 + 1;
      iVar35 = iVar12 + iVar53;
      if ((iVar58 < iVar32) || (iVar42 <= iVar31)) {
        if (0 < w) {
          lVar37 = (long)local_168;
          piVar44 = repfnz;
          pdVar41 = dense;
          iVar47 = jcol;
          do {
            iVar48 = piVar44[iVar10];
            if (iVar48 != -1) {
              ncol = (iVar10 - iVar48) + 1;
              iVar56 = piVar19[iVar11];
              pfVar13[0x13] = (float)(int)((iVar10 - iVar48) * ncol * 4) + pfVar13[0x13];
              pfVar13[0x14] = (float)(int)(iVar42 * 8 * ncol) + pfVar13[0x14];
              if (iVar10 == iVar48) {
                iVar48 = piVar17[(long)iVar11 + 1];
                if (local_168 < iVar48) {
                  dVar27 = pdVar41[piVar16[iVar35]].r;
                  dVar26 = pdVar41[piVar16[iVar35]].i;
                  pdVar40 = (double *)
                            ((long)pvVar18 + (long)(iVar56 + iVar53 * iVar34 + iVar58) * 0x10 + 8);
                  lVar43 = lVar37;
                  do {
                    iVar56 = piVar16[lVar43];
                    dVar60 = pdVar40[-1];
                    dVar61 = *pdVar40;
                    dVar3 = pdVar41[iVar56].i;
                    pdVar41[iVar56].r = pdVar41[iVar56].r - (dVar60 * dVar27 + dVar61 * -dVar26);
                    pdVar41[iVar56].i = dVar3 - (dVar60 * dVar26 + dVar61 * dVar27);
                    lVar43 = lVar43 + 1;
                    pdVar40 = pdVar40 + 2;
                  } while (lVar43 < iVar48);
                }
              }
              else if (iVar10 - iVar48 < 3) {
                iVar56 = iVar56 + (iVar34 + 1) * iVar53;
                iVar48 = piVar16[(long)iVar35 + -1];
                dVar27 = pdVar41[piVar16[iVar35]].r;
                dVar26 = pdVar41[piVar16[iVar35]].i;
                dVar60 = pdVar41[iVar48].r;
                dVar61 = pdVar41[iVar48].i;
                iVar39 = iVar56 - iVar34;
                if (ncol == 2) {
                  lVar43 = (long)iVar39 * 0x10;
                  dVar3 = *(double *)((long)pvVar18 + lVar43 + 8);
                  dVar27 = dVar27 - (*(double *)((long)pvVar18 + lVar43) * dVar60 + dVar3 * -dVar61)
                  ;
                  dVar26 = dVar26 - (*(double *)((long)pvVar18 + lVar43) * dVar61 + dVar3 * dVar60);
                  dVar23.i._0_4_ = SUB84(dVar26,0);
                  dVar23.r = dVar27;
                  dVar23.i._4_4_ = (int)((ulong)dVar26 >> 0x20);
                  pdVar41[piVar16[iVar35]] = dVar23;
                  iVar48 = piVar17[(long)iVar11 + 1];
                  if (local_168 < iVar48) {
                    lVar49 = lVar1;
                    lVar52 = lVar37;
                    do {
                      iVar39 = piVar16[lVar52];
                      dVar3 = *(double *)(lVar49 + -8 + (long)iVar56 * 0x10);
                      dVar4 = *(double *)(lVar49 + (long)iVar56 * 0x10);
                      dVar5 = *(double *)(lVar49 + -8 + lVar43);
                      dVar6 = *(double *)(lVar49 + lVar43);
                      dVar28 = pdVar41[iVar39].i;
                      pdVar41[iVar39].r =
                           pdVar41[iVar39].r -
                           (dVar5 * dVar60 + dVar6 * -dVar61 + dVar3 * dVar27 + dVar4 * -dVar26);
                      pdVar41[iVar39].i =
                           dVar28 - (dVar5 * dVar61 + dVar6 * dVar60 +
                                    dVar3 * dVar26 + dVar4 * dVar27);
                      lVar52 = lVar52 + 1;
                      lVar49 = lVar49 + 0x10;
                    } while (lVar52 < iVar48);
                  }
                }
                else {
                  lVar49 = (long)(iVar39 - iVar34) * 0x10;
                  lVar43 = (long)iVar39 * 0x10;
                  dVar6 = pdVar41[piVar16[(long)iVar35 + -2]].r;
                  dVar28 = pdVar41[piVar16[(long)iVar35 + -2]].i;
                  dVar62 = -dVar28;
                  dVar3 = *(double *)((long)pvVar18 + lVar49 + -0x10);
                  dVar4 = *(double *)((long)pvVar18 + lVar49 + -8);
                  dVar5 = *(double *)((long)pvVar18 + lVar49 + 8);
                  dVar60 = dVar60 - (dVar3 * dVar6 + dVar4 * dVar62);
                  dVar61 = dVar61 - (dVar3 * dVar28 + dVar4 * dVar6);
                  dVar3 = *(double *)((long)pvVar18 + lVar43 + 8);
                  dVar27 = dVar27 - (*(double *)((long)pvVar18 + lVar49) * dVar6 + dVar5 * dVar62 +
                                    *(double *)((long)pvVar18 + lVar43) * dVar60 + dVar3 * -dVar61);
                  dVar26 = dVar26 - (*(double *)((long)pvVar18 + lVar49) * dVar28 + dVar5 * dVar6 +
                                    *(double *)((long)pvVar18 + lVar43) * dVar61 + dVar3 * dVar60);
                  dVar24.i._0_4_ = SUB84(dVar26,0);
                  dVar24.r = dVar27;
                  dVar24.i._4_4_ = (int)((ulong)dVar26 >> 0x20);
                  pdVar41[piVar16[iVar35]] = dVar24;
                  pdVar41[iVar48].r = dVar60;
                  pdVar41[iVar48].i = dVar61;
                  iVar48 = piVar17[(long)iVar11 + 1];
                  if (local_168 < iVar48) {
                    lVar50 = (long)iVar34 * -0x10 + lVar43;
                    lVar49 = lVar1;
                    lVar52 = lVar37;
                    do {
                      iVar39 = piVar16[lVar52];
                      dVar3 = *(double *)(lVar49 + -8 + (long)iVar56 * 0x10);
                      dVar4 = *(double *)(lVar49 + (long)iVar56 * 0x10);
                      dVar5 = *(double *)(lVar49 + -8 + lVar43);
                      dVar7 = *(double *)(lVar49 + lVar43);
                      dVar8 = *(double *)(lVar49 + -8 + lVar50);
                      dVar9 = *(double *)(lVar49 + lVar50);
                      dVar29 = pdVar41[iVar39].i;
                      pdVar41[iVar39].r =
                           pdVar41[iVar39].r -
                           (dVar8 * dVar6 + dVar9 * dVar62 +
                           dVar5 * dVar60 + dVar7 * -dVar61 + dVar3 * dVar27 + dVar4 * -dVar26);
                      pdVar41[iVar39].i =
                           dVar29 - (dVar8 * dVar28 + dVar9 * dVar6 +
                                    dVar5 * dVar61 + dVar7 * dVar60 +
                                    dVar3 * dVar26 + dVar4 * dVar27);
                      lVar52 = lVar52 + 1;
                      lVar49 = lVar49 + 0x10;
                    } while (lVar52 < iVar48);
                  }
                }
              }
              else {
                uVar57 = (ulong)(uint)((iVar10 + 1) - iVar48);
                iVar39 = (iVar48 - iVar11) + iVar12;
                lVar43 = 0;
                uVar54 = uVar57;
                do {
                  dVar27 = pdVar41[*(int *)((long)piVar16 + lVar43 + (long)iVar39 * 4)].i;
                  pdVar40 = (double *)((long)&tempv->r + lVar43 * 4);
                  *pdVar40 = pdVar41[*(int *)((long)piVar16 + lVar43 + (long)iVar39 * 4)].r;
                  pdVar40[1] = dVar27;
                  lVar43 = lVar43 + 4;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
                iVar56 = iVar56 + (iVar48 - iVar11) * (iVar34 + 1);
                zlsolve(iVar34,ncol,(doublecomplex *)((long)iVar56 * 0x10 + (long)pvVar18),tempv);
                pdVar59 = tempv + ncol;
                zmatvec(iVar34,iVar42,ncol,
                        (doublecomplex *)((long)(int)(iVar56 + ncol) * 0x10 + (long)pvVar18),tempv,
                        pdVar59);
                uVar54 = 0;
                pdVar46 = tempv;
                iVar48 = iVar39;
                do {
                  iVar56 = piVar16[(long)iVar39 + uVar54];
                  dVar27 = pdVar46->i;
                  pdVar41[iVar56].r = pdVar46->r;
                  pdVar41[iVar56].i = dVar27;
                  pdVar46->r = 0.0;
                  pdVar46->i = 0.0;
                  uVar54 = uVar54 + 1;
                  pdVar46 = pdVar46 + 1;
                  iVar48 = iVar48 + 1;
                } while (uVar57 != uVar54);
                if (0 < iVar42) {
                  lVar43 = 0;
                  do {
                    dVar27 = pdVar41[piVar16[iVar48 + lVar43]].i - pdVar59->i;
                    dVar25.i._0_4_ = SUB84(dVar27,0);
                    dVar25.r = pdVar41[piVar16[iVar48 + lVar43]].r - pdVar59->r;
                    dVar25.i._4_4_ = (int)((ulong)dVar27 >> 0x20);
                    pdVar41[piVar16[iVar48 + lVar43]] = dVar25;
                    pdVar59->r = 0.0;
                    pdVar59->i = 0.0;
                    lVar43 = lVar43 + 1;
                    pdVar59 = pdVar59 + 1;
                  } while (lVar43 < iVar42);
                }
              }
            }
            iVar47 = iVar47 + 1;
            piVar44 = piVar44 + m;
            pdVar41 = pdVar41 + m;
          } while (iVar47 < iVar55);
        }
      }
      else {
        if (0 < w) {
          lVar37 = (long)local_168;
          pdVar41 = tempv;
          pdVar46 = dense;
          piVar44 = repfnz;
          iVar47 = jcol;
          do {
            iVar48 = piVar44[iVar10];
            if (iVar48 != -1) {
              iVar56 = (iVar10 - iVar48) + 1;
              iVar39 = piVar19[iVar11];
              pfVar13[0x13] = (float)((iVar10 - iVar48) * iVar56 * 4) + pfVar13[0x13];
              pfVar13[0x14] = (float)(iVar42 * 8 * iVar56) + pfVar13[0x14];
              if (iVar10 == iVar48) {
                iVar48 = piVar17[(long)iVar11 + 1];
                if (local_168 < iVar48) {
                  dVar27 = pdVar46[piVar16[iVar35]].r;
                  dVar26 = pdVar46[piVar16[iVar35]].i;
                  pdVar40 = (double *)
                            ((long)pvVar18 + (long)(iVar39 + iVar53 * iVar34 + iVar58) * 0x10 + 8);
                  lVar43 = lVar37;
                  do {
                    iVar56 = piVar16[lVar43];
                    dVar60 = pdVar40[-1];
                    dVar61 = *pdVar40;
                    dVar3 = pdVar46[iVar56].i;
                    pdVar46[iVar56].r = pdVar46[iVar56].r - (dVar60 * dVar27 + dVar61 * -dVar26);
                    pdVar46[iVar56].i = dVar3 - (dVar60 * dVar26 + dVar61 * dVar27);
                    lVar43 = lVar43 + 1;
                    pdVar40 = pdVar40 + 2;
                  } while (lVar43 < iVar48);
                }
              }
              else if (iVar10 - iVar48 < 3) {
                iVar48 = piVar16[(long)iVar35 + -1];
                dVar27 = pdVar46[piVar16[iVar35]].r;
                dVar26 = pdVar46[piVar16[iVar35]].i;
                dVar60 = pdVar46[iVar48].r;
                dVar61 = pdVar46[iVar48].i;
                iVar39 = iVar39 + (iVar34 + 1) * iVar53;
                iVar36 = iVar39 - iVar34;
                if (iVar56 == 2) {
                  lVar43 = (long)iVar36 * 0x10;
                  dVar3 = *(double *)((long)pvVar18 + lVar43 + 8);
                  dVar27 = dVar27 - (*(double *)((long)pvVar18 + lVar43) * dVar60 + dVar3 * -dVar61)
                  ;
                  dVar26 = dVar26 - (*(double *)((long)pvVar18 + lVar43) * dVar61 + dVar3 * dVar60);
                  dVar21.i._0_4_ = SUB84(dVar26,0);
                  dVar21.r = dVar27;
                  dVar21.i._4_4_ = (int)((ulong)dVar26 >> 0x20);
                  pdVar46[piVar16[iVar35]] = dVar21;
                  iVar48 = piVar17[(long)iVar11 + 1];
                  if (local_168 < iVar48) {
                    lVar49 = lVar1;
                    lVar52 = lVar37;
                    do {
                      iVar56 = piVar16[lVar52];
                      dVar3 = *(double *)(lVar49 + -8 + (long)iVar39 * 0x10);
                      dVar4 = *(double *)(lVar49 + (long)iVar39 * 0x10);
                      dVar5 = *(double *)(lVar49 + -8 + lVar43);
                      dVar6 = *(double *)(lVar49 + lVar43);
                      dVar28 = pdVar46[iVar56].i;
                      pdVar46[iVar56].r =
                           pdVar46[iVar56].r -
                           (dVar5 * dVar60 + dVar6 * -dVar61 + dVar3 * dVar27 + dVar4 * -dVar26);
                      pdVar46[iVar56].i =
                           dVar28 - (dVar5 * dVar61 + dVar6 * dVar60 +
                                    dVar3 * dVar26 + dVar4 * dVar27);
                      lVar52 = lVar52 + 1;
                      lVar49 = lVar49 + 0x10;
                    } while (lVar52 < iVar48);
                  }
                }
                else {
                  lVar49 = (long)(iVar36 - iVar34) * 0x10;
                  lVar43 = (long)iVar36 * 0x10;
                  dVar6 = pdVar46[piVar16[(long)iVar35 + -2]].r;
                  dVar28 = pdVar46[piVar16[(long)iVar35 + -2]].i;
                  dVar62 = -dVar28;
                  dVar3 = *(double *)((long)pvVar18 + lVar49 + -0x10);
                  dVar4 = *(double *)((long)pvVar18 + lVar49 + -8);
                  dVar5 = *(double *)((long)pvVar18 + lVar49 + 8);
                  dVar60 = dVar60 - (dVar3 * dVar6 + dVar4 * dVar62);
                  dVar61 = dVar61 - (dVar3 * dVar28 + dVar4 * dVar6);
                  dVar3 = *(double *)((long)pvVar18 + lVar43 + 8);
                  dVar27 = dVar27 - (*(double *)((long)pvVar18 + lVar49) * dVar6 + dVar5 * dVar62 +
                                    *(double *)((long)pvVar18 + lVar43) * dVar60 + dVar3 * -dVar61);
                  dVar26 = dVar26 - (*(double *)((long)pvVar18 + lVar49) * dVar28 + dVar5 * dVar6 +
                                    *(double *)((long)pvVar18 + lVar43) * dVar61 + dVar3 * dVar60);
                  dVar22.i._0_4_ = SUB84(dVar26,0);
                  dVar22.r = dVar27;
                  dVar22.i._4_4_ = (int)((ulong)dVar26 >> 0x20);
                  pdVar46[piVar16[iVar35]] = dVar22;
                  pdVar46[iVar48].r = dVar60;
                  pdVar46[iVar48].i = dVar61;
                  iVar48 = piVar17[(long)iVar11 + 1];
                  if (local_168 < iVar48) {
                    lVar50 = (long)iVar34 * -0x10 + lVar43;
                    lVar49 = lVar1;
                    lVar52 = lVar37;
                    do {
                      iVar56 = piVar16[lVar52];
                      dVar3 = *(double *)(lVar49 + -8 + (long)iVar39 * 0x10);
                      dVar4 = *(double *)(lVar49 + (long)iVar39 * 0x10);
                      dVar5 = *(double *)(lVar49 + -8 + lVar43);
                      dVar7 = *(double *)(lVar49 + lVar43);
                      dVar8 = *(double *)(lVar49 + -8 + lVar50);
                      dVar9 = *(double *)(lVar49 + lVar50);
                      dVar29 = pdVar46[iVar56].i;
                      pdVar46[iVar56].r =
                           pdVar46[iVar56].r -
                           (dVar8 * dVar6 + dVar9 * dVar62 +
                           dVar5 * dVar60 + dVar7 * -dVar61 + dVar3 * dVar27 + dVar4 * -dVar26);
                      pdVar46[iVar56].i =
                           dVar29 - (dVar8 * dVar28 + dVar9 * dVar6 +
                                    dVar5 * dVar61 + dVar7 * dVar60 +
                                    dVar3 * dVar26 + dVar4 * dVar27);
                      lVar52 = lVar52 + 1;
                      lVar49 = lVar49 + 0x10;
                    } while (lVar52 < iVar48);
                  }
                }
              }
              else {
                uVar54 = (ulong)(uint)((iVar10 + 1) - iVar48);
                lVar43 = 0;
                do {
                  dVar27 = pdVar46[*(int *)((long)piVar16 +
                                           lVar43 + (long)(iVar12 + (iVar48 - iVar11)) * 4)].i;
                  pdVar40 = (double *)((long)&pdVar41->r + lVar43 * 4);
                  *pdVar40 = pdVar46[*(int *)((long)piVar16 +
                                             lVar43 + (long)(iVar12 + (iVar48 - iVar11)) * 4)].r;
                  pdVar40[1] = dVar27;
                  lVar43 = lVar43 + 4;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
                zlsolve(iVar34,iVar56,
                        (doublecomplex *)
                        ((long)(iVar39 + (iVar48 - iVar11) * (iVar34 + 1)) * 0x10 + (long)pvVar18),
                        pdVar41);
              }
            }
            iVar47 = iVar47 + 1;
            piVar44 = piVar44 + m;
            pdVar46 = pdVar46 + m;
            pdVar41 = pdVar41 + iVar33;
          } while (iVar47 < iVar55);
        }
        if (0 < iVar42) {
          iVar35 = 0;
          do {
            iVar47 = iVar35 + iVar31;
            iVar53 = iVar47;
            if (iVar42 < iVar47) {
              iVar53 = iVar42;
            }
            iVar48 = iVar53 - iVar35;
            if (iVar31 < iVar53 - iVar35) {
              iVar48 = iVar31;
            }
            if (0 < w) {
              iVar53 = piVar19[iVar11];
              piVar44 = repfnz;
              pdVar41 = dense;
              pdVar46 = tempv + iVar30;
              pdVar59 = tempv;
              iVar56 = jcol;
              do {
                iVar39 = piVar44[iVar10];
                if (((iVar39 != -1) && (2 < iVar10 - iVar39)) &&
                   (zmatvec(iVar34,iVar48,(iVar10 - iVar39) + 1,
                            (doublecomplex *)
                            ((long)((iVar39 - iVar11) * iVar34 + iVar35 + iVar58 + iVar53) * 0x10 +
                            (long)pvVar18),pdVar59,pdVar59 + iVar30), 0 < iVar48)) {
                  lVar37 = 0;
                  pdVar38 = pdVar46;
                  do {
                    dVar27 = pdVar41[piVar16[local_168 + lVar37]].i - pdVar38->i;
                    dVar20.i._0_4_ = SUB84(dVar27,0);
                    dVar20.r = pdVar41[piVar16[local_168 + lVar37]].r - pdVar38->r;
                    dVar20.i._4_4_ = (int)((ulong)dVar27 >> 0x20);
                    pdVar41[piVar16[local_168 + lVar37]] = dVar20;
                    pdVar38->r = 0.0;
                    pdVar38->i = 0.0;
                    lVar37 = lVar37 + 1;
                    pdVar38 = pdVar38 + 1;
                  } while (lVar37 < iVar48);
                }
                iVar56 = iVar56 + 1;
                piVar44 = piVar44 + m;
                pdVar41 = pdVar41 + m;
                pdVar59 = pdVar59 + iVar33;
                pdVar46 = pdVar46 + iVar33;
              } while (iVar56 < iVar55);
            }
            local_168 = local_168 + iVar31;
            iVar35 = iVar47;
          } while (iVar47 < iVar42);
        }
        if (0 < w) {
          pdVar41 = tempv;
          piVar44 = repfnz;
          pdVar46 = dense;
          iVar34 = jcol;
          do {
            iVar35 = piVar44[iVar10];
            if ((iVar35 != -1) && (2 < iVar10 - iVar35)) {
              uVar54 = (ulong)(uint)((iVar10 + 1) - iVar35);
              lVar37 = 0;
              do {
                iVar42 = *(int *)((long)piVar16 + lVar37 + (long)((iVar12 - iVar11) + iVar35) * 4);
                pdVar40 = (double *)((long)&pdVar41->r + lVar37 * 4);
                dVar27 = pdVar40[1];
                pdVar46[iVar42].r = *pdVar40;
                pdVar46[iVar42].i = dVar27;
                puVar2 = (undefined8 *)((long)&pdVar41->r + lVar37 * 4);
                *puVar2 = 0;
                puVar2[1] = 0;
                lVar37 = lVar37 + 4;
                uVar54 = uVar54 - 1;
              } while (uVar54 != 0);
            }
            iVar34 = iVar34 + 1;
            piVar44 = piVar44 + m;
            pdVar46 = pdVar46 + m;
            pdVar41 = pdVar41 + iVar33;
          } while (iVar34 < iVar55);
        }
      }
      uVar45 = uVar45 - 1;
      iVar51 = iVar51 + 1;
    } while (iVar51 != nseg);
  }
  return;
}

Assistant:

void
zpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    doublecomplex     *dense,     /* out, of size n by w */
	    doublecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    doublecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    doublecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    doublecomplex       *dense_col;  /* dense[] for a column in the panel */
    doublecomplex       *tempv1;             /* Used in 1-D update */
    doublecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    zlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    zgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    zmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    zlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    zmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}